

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_bindings.cpp
# Opt level: O0

void printVector<double>(vector<double,_std::allocator<double>_> *vector)

{
  bool bVar1;
  reference pdVar2;
  ostream *poVar3;
  double *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> *vector_local;
  
  std::operator<<((ostream *)&std::cout,"[ ");
  __end0 = std::vector<double,_std::allocator<double>_>::begin(vector);
  elem = (double *)std::vector<double,_std::allocator<double>_>::end(vector);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&elem);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end0);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pdVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  std::operator<<((ostream *)&std::cout,"]");
  return;
}

Assistant:

void printVector(const std::vector<T>& vector)
{
    std::cout << "[ ";
    for (const auto& elem: vector)
    {
        std::cout << elem << " ";
    }
    std::cout << "]";
}